

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_pkware_encode.c
# Opt level: O0

zip_source_t *
zip_source_pkware_encode(zip_t *za,zip_source_t *src,zip_uint16_t em,int flags,char *password)

{
  int iVar1;
  trad_pkware_conflict *ctx_00;
  zip_uint64_t local_88;
  undefined1 local_80 [8];
  zip_stat_t st;
  zip_source_t *s2;
  trad_pkware_conflict *ctx;
  char *password_local;
  int flags_local;
  zip_uint16_t em_local;
  zip_source_t *src_local;
  zip_t *za_local;
  
  if (((password == (char *)0x0) || (src == (zip_source_t *)0x0)) || (em != 1)) {
    zip_error_set(&za->error,0x12,0);
    za_local = (zip_t *)0x0;
  }
  else if ((flags & 1U) == 0) {
    zip_error_set(&za->error,0x18,0);
    za_local = (zip_t *)0x0;
  }
  else {
    ctx_00 = trad_pkware_new(password,&za->error);
    if (ctx_00 == (trad_pkware_conflict *)0x0) {
      zip_error_set(&za->error,0xe,0);
      za_local = (zip_t *)0x0;
    }
    else {
      iVar1 = zip_source_get_dos_time(src,&ctx_00->dostime);
      if (iVar1 < 1) {
        iVar1 = zip_source_stat(src,(zip_stat_t *)local_80);
        if (iVar1 < 0) {
          zip_error_set_from_source(&za->error,src);
          trad_pkware_free(ctx_00);
          return (zip_source_t *)0x0;
        }
        if (((ulong)local_80 & 0x10) == 0) {
          local_88 = time((time_t *)0x0);
        }
        else {
          local_88 = st.comp_size;
        }
        iVar1 = _zip_u2d_time(local_88,&ctx_00->dostime,&za->error);
        if (iVar1 < 0) {
          trad_pkware_free(ctx_00);
          return (zip_source_t *)0x0;
        }
      }
      st._56_8_ = zip_source_layered(za,src,pkware_encrypt,ctx_00);
      za_local = (zip_t *)st._56_8_;
      if ((zip_t *)st._56_8_ == (zip_t *)0x0) {
        trad_pkware_free(ctx_00);
        za_local = (zip_t *)0x0;
      }
    }
  }
  return (zip_source_t *)za_local;
}

Assistant:

zip_source_t *
zip_source_pkware_encode(zip_t *za, zip_source_t *src, zip_uint16_t em, int flags, const char *password) {
    struct trad_pkware *ctx;
    zip_source_t *s2;

    if (password == NULL || src == NULL || em != ZIP_EM_TRAD_PKWARE) {
        zip_error_set(&za->error, ZIP_ER_INVAL, 0);
        return NULL;
    }
    if (!(flags & ZIP_CODEC_ENCODE)) {
        zip_error_set(&za->error, ZIP_ER_ENCRNOTSUPP, 0);
        return NULL;
    }

    if ((ctx = trad_pkware_new(password, &za->error)) == NULL) {
        zip_error_set(&za->error, ZIP_ER_MEMORY, 0);
        return NULL;
    }

    if (zip_source_get_dos_time(src, &ctx->dostime) <= 0) {
        zip_stat_t st;

        if (zip_source_stat(src, &st) < 0) {
            zip_error_set_from_source(&za->error, src);
            trad_pkware_free(ctx);
            return NULL;
        }
        if (_zip_u2d_time((st.valid & ZIP_STAT_MTIME) ? st.mtime : time(NULL), &ctx->dostime, &za->error) < 0) {
            trad_pkware_free(ctx);
            return NULL;
        }
    }

    if ((s2 = zip_source_layered(za, src, pkware_encrypt, ctx)) == NULL) {
        trad_pkware_free(ctx);
        return NULL;
    }

    return s2;
}